

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerDeleteElemI(Lowerer *this,Instr *instr,bool strictMode)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  int32 iVar5;
  Opnd *this_00;
  undefined4 *puVar6;
  IndirOpnd *pIVar7;
  IntConstOpnd *opndArg;
  RegOpnd *opndArg_00;
  Opnd *baseOpnd;
  IntConstType offset;
  Opnd *indexOpnd;
  JnHelperMethod helperMethod;
  PropertyOperationFlags propertyOperationFlag;
  Opnd *src1;
  Instr *instrPrev;
  bool strictMode_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  this_00 = IR::Instr::UnlinkSrc1(instr);
  bVar3 = IR::Opnd::IsIndirOpnd(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x26cc,"(src1->IsIndirOpnd())","Expected indirOpnd on DeleteElementI");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  indexOpnd._4_4_ = (uint)strictMode;
  pIVar1 = instr->m_prev;
  indexOpnd._0_4_ = HelperOp_DeleteElementI;
  pIVar7 = IR::Opnd::AsIndirOpnd(this_00);
  offset = (IntConstType)IR::IndirOpnd::UnlinkIndexOpnd(pIVar7);
  if ((RegOpnd *)offset == (RegOpnd *)0x0) {
    pIVar7 = IR::Opnd::AsIndirOpnd(this_00);
    iVar5 = IR::IndirOpnd::GetOffset(pIVar7);
    offset = (IntConstType)IR::AddrOpnd::NewFromNumber((long)iVar5,this->m_func,false);
  }
  else {
    IVar4 = IR::Opnd::GetType((Opnd *)offset);
    if (IVar4 == TyInt32) {
      indexOpnd._0_4_ = HelperOp_DeleteElementI_Int32;
    }
    else {
      IVar4 = IR::Opnd::GetType((Opnd *)offset);
      if (IVar4 == TyUint32) {
        indexOpnd._0_4_ = HelperOp_DeleteElementI_UInt32;
      }
      else {
        IVar4 = IR::Opnd::GetType((Opnd *)offset);
        if (IVar4 != TyVar) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x26e4,"(indexOpnd->GetType() == TyVar)",
                             "indexOpnd->GetType() == TyVar");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
  }
  opndArg = IR::IntConstOpnd::New((long)(int)indexOpnd._4_4_,TyInt32,this->m_func,true);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  LoadScriptContext(this,instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,(Opnd *)offset);
  pIVar7 = IR::Opnd::AsIndirOpnd(this_00);
  opndArg_00 = IR::IndirOpnd::UnlinkBaseOpnd(pIVar7);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg_00->super_Opnd);
  IR::Opnd::Free(this_00,this->m_func);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr,(JnHelperMethod)indexOpnd,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerDeleteElemI(IR::Instr * instr, bool strictMode)
{
    IR::Instr *instrPrev;

    IR::Opnd *src1 = instr->UnlinkSrc1();

    AssertMsg(src1->IsIndirOpnd(), "Expected indirOpnd on DeleteElementI");

    Js::PropertyOperationFlags propertyOperationFlag = Js::PropertyOperation_None;

    if (strictMode)
    {
        propertyOperationFlag = Js::PropertyOperation_StrictMode;
    }

    instrPrev = instr->m_prev;
    IR::JnHelperMethod helperMethod = IR::HelperOp_DeleteElementI;
    IR::Opnd *indexOpnd = src1->AsIndirOpnd()->UnlinkIndexOpnd();
    if (indexOpnd)
    {
        if (indexOpnd->GetType() == TyInt32)
        {
            helperMethod = IR::HelperOp_DeleteElementI_Int32;
        }
        else if (indexOpnd->GetType() == TyUint32)
        {
            helperMethod = IR::HelperOp_DeleteElementI_UInt32;
        }
        else
        {
            Assert(indexOpnd->GetType() == TyVar);
        }
    }
    else
    {
        // No index; the offset identifies the element.
        IntConstType offset = (IntConstType)src1->AsIndirOpnd()->GetOffset();
        indexOpnd = IR::AddrOpnd::NewFromNumber(offset, m_func);
    }

    m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New((IntConstType)propertyOperationFlag, TyInt32, m_func, true));
    LoadScriptContext(instr);
    m_lowererMD.LoadHelperArgument(instr, indexOpnd);

    IR::Opnd *baseOpnd = src1->AsIndirOpnd()->UnlinkBaseOpnd();
    m_lowererMD.LoadHelperArgument(instr, baseOpnd);

    src1->Free(this->m_func);

    m_lowererMD.ChangeToHelperCall(instr, helperMethod);

    return instrPrev;
}